

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O3

void __thiscall
google::protobuf::internal::EpsCopyInputStream::BackUp(EpsCopyInputStream *this,char *ptr)

{
  LogMessage *other;
  uint uVar1;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (this->buffer_end_ + 0x10 < ptr) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/parse_context.h"
               ,0x74);
    other = LogMessage::operator<<(&local_60,"CHECK failed: ptr <= buffer_end_ + kSlopBytes: ");
    LogFinisher::operator=(&local_21,other);
    LogMessage::~LogMessage(&local_60);
  }
  if (this->next_chunk_ == this->buffer_) {
    uVar1 = (*(int *)&this->buffer_end_ - (int)ptr) + 0x10;
  }
  else {
    uVar1 = (*(int *)&this->buffer_end_ - (int)ptr) + this->size_;
  }
  if (0 < (int)uVar1) {
    (*this->zcis_->_vptr_ZeroCopyInputStream[3])(this->zcis_,(ulong)uVar1);
    this->overall_limit_ = this->overall_limit_ + uVar1;
  }
  return;
}

Assistant:

void BackUp(const char* ptr) {
    GOOGLE_DCHECK(ptr <= buffer_end_ + kSlopBytes);
    int count;
    if (next_chunk_ == buffer_) {
      count = static_cast<int>(buffer_end_ + kSlopBytes - ptr);
    } else {
      count = size_ + static_cast<int>(buffer_end_ - ptr);
    }
    if (count > 0) StreamBackUp(count);
  }